

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ElsePropertyClauseSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ElsePropertyClauseSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  ElsePropertyClauseSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->elseKeyword).kind;
    token._2_1_ = (this->elseKeyword).field_0x2;
    token.numFlags.raw = (this->elseKeyword).numFlags.raw;
    token.rawLen = (this->elseKeyword).rawLen;
    token.info = (this->elseKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = &not_null<slang::syntax::PropertyExprSyntax_*>::get(&this->expr)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ElsePropertyClauseSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return elseKeyword;
        case 1: return expr.get();
        default: return nullptr;
    }
}